

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

void __thiscall helics::ValueFederate::~ValueFederate(ValueFederate *this)

{
  this->_vptr_ValueFederate = (_func_int **)0x4cbc50;
  *(undefined8 *)&this->field_0x10 = 0x4cbd20;
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::~unique_ptr(&this->vfManager);
  Federate::~Federate((Federate *)&this->field_0x10);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

void ValueFederate::loadFederateData()
{
    vfManager = std::make_unique<ValueFederateManager>(coreObject.get(),
                                                       this,
                                                       getID(),
                                                       singleThreadFederate);
    vfManager->useJsonSerialization = useJsonSerialization;
    if (!configFile.empty()) {
        ValueFederate::registerValueInterfaces(configFile);
    }
}